

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_begin_window_ex(mu_Context *ctx,char *title,mu_Rect rect,int opt)

{
  mu_Rect *pmVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 y;
  undefined4 uVar6;
  undefined4 uVar7;
  mu_Rect rect_00;
  mu_Rect rect_01;
  mu_Rect body_00;
  mu_Rect mVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  mu_Id mVar21;
  size_t sVar22;
  mu_Container *cnt_00;
  mu_Layout *pmVar23;
  mu_Rect mVar24;
  int local_b8;
  int local_b4;
  mu_Rect r_2;
  mu_Rect r_1;
  mu_Id id_3;
  int sz;
  mu_Rect r;
  mu_Id id_2;
  mu_Id id_1;
  mu_Rect tr;
  mu_Container *cnt;
  mu_Id id;
  mu_Rect body;
  int opt_local;
  char *title_local;
  mu_Context *ctx_local;
  mu_Rect rect_local;
  
  sVar22 = strlen(title);
  mVar21 = mu_get_id(ctx,title,(int)sVar22);
  cnt_00 = get_container(ctx,mVar21,opt);
  if ((cnt_00 == (mu_Container *)0x0) || (cnt_00->open == 0)) {
    rect_local.w = 0;
  }
  else {
    if (0x1f < (ctx->id_stack).idx) {
      fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
              ,0x440,
              "(ctx->id_stack).idx < (int) (sizeof((ctx->id_stack).items) / sizeof(*(ctx->id_stack).items))"
             );
      abort();
    }
    (ctx->id_stack).items[(ctx->id_stack).idx] = mVar21;
    (ctx->id_stack).idx = (ctx->id_stack).idx + 1;
    if (((cnt_00->rect).w == 0) || ((opt & 0x2000U) != 0)) {
      (cnt_00->rect).x = (int)rect._0_8_;
      (cnt_00->rect).y = (int)((ulong)rect._0_8_ >> 0x20);
      (cnt_00->rect).w = (int)rect._8_8_;
      (cnt_00->rect).h = (int)((ulong)rect._8_8_ >> 0x20);
    }
    begin_root_container(ctx,cnt_00);
    pmVar1 = &cnt_00->rect;
    uVar3 = pmVar1->x;
    y = pmVar1->y;
    uVar4 = (cnt_00->rect).w;
    uVar6 = (cnt_00->rect).h;
    uVar18 = pmVar1->x;
    uVar19 = pmVar1->y;
    uVar20 = pmVar1->w;
    rect_01.w = uVar20;
    rect_01.y = uVar19;
    rect_01.x = uVar18;
    uVar15 = pmVar1->x;
    uVar16 = pmVar1->y;
    uVar17 = pmVar1->w;
    rect_00.w = uVar17;
    rect_00.y = uVar16;
    rect_00.x = uVar15;
    uVar12 = pmVar1->x;
    uVar13 = pmVar1->y;
    uVar14 = pmVar1->w;
    mVar24.w = uVar14;
    mVar24.y = uVar13;
    mVar24.x = uVar12;
    uVar9 = pmVar1->x;
    uVar10 = pmVar1->y;
    uVar11 = pmVar1->w;
    mVar8.w = uVar11;
    mVar8.y = uVar10;
    mVar8.x = uVar9;
    if (((opt ^ 0xffffffffU) & 8) != 0) {
      mVar8.h = uVar6;
      (*ctx->draw_frame)(ctx,mVar8,2);
    }
    id = y;
    body.y = uVar6;
    if (((opt ^ 0xffffffffU) & 0x80) != 0) {
      iVar2 = ctx->style->title_height;
      mVar24.h = iVar2;
      (*ctx->draw_frame)(ctx,mVar24,3);
      if (((opt ^ 0xffffffffU) & 0x80) != 0) {
        mVar21 = mu_get_id(ctx,"!title",6);
        rect_00.h = iVar2;
        mu_update_control(ctx,mVar21,rect_00,opt);
        rect_01.h = iVar2;
        mu_draw_control_text(ctx,title,rect_01,4,opt);
        if ((mVar21 == ctx->focus) && (ctx->mouse_down == 1)) {
          (cnt_00->rect).x = (ctx->mouse_delta).x + (cnt_00->rect).x;
          (cnt_00->rect).y = (ctx->mouse_delta).y + (cnt_00->rect).y;
        }
        id = iVar2 + y;
        body.y = uVar6 - iVar2;
      }
      if (((opt ^ 0xffffffffU) & 0x40) != 0) {
        mVar21 = mu_get_id(ctx,"!close",6);
        mVar24 = mu_rect((uVar3 + uVar4) - iVar2,y,iVar2,iVar2);
        mu_draw_icon(ctx,1,mVar24,ctx->style->colors[4]);
        mu_update_control(ctx,mVar21,mVar24,opt);
        if ((ctx->mouse_pressed == 1) && (mVar21 == ctx->focus)) {
          cnt_00->open = 0;
        }
      }
    }
    body_00.y = id;
    body_00.x = uVar3;
    body_00.w = uVar4;
    body_00.h = body.y;
    push_container_body(ctx,cnt_00,body_00,opt);
    if (((opt ^ 0xffffffffU) & 0x10) != 0) {
      iVar2 = ctx->style->title_height;
      mVar21 = mu_get_id(ctx,"!resize",7);
      mVar24 = mu_rect((uVar3 + uVar4) - iVar2,(y + uVar6) - iVar2,iVar2,iVar2);
      mu_update_control(ctx,mVar21,mVar24,opt);
      if ((mVar21 == ctx->focus) && (ctx->mouse_down == 1)) {
        if ((cnt_00->rect).w + (ctx->mouse_delta).x < 0x60) {
          local_b4 = 0x60;
        }
        else {
          local_b4 = (cnt_00->rect).w + (ctx->mouse_delta).x;
        }
        (cnt_00->rect).w = local_b4;
        if ((cnt_00->rect).h + (ctx->mouse_delta).y < 0x40) {
          local_b8 = 0x40;
        }
        else {
          local_b8 = (cnt_00->rect).h + (ctx->mouse_delta).y;
        }
        (cnt_00->rect).h = local_b8;
      }
    }
    if ((opt & 0x200U) != 0) {
      pmVar23 = get_layout(ctx);
      uVar5 = (pmVar23->body).w;
      uVar7 = (pmVar23->body).h;
      (cnt_00->rect).w = (cnt_00->content_size).x + ((cnt_00->rect).w - uVar5);
      (cnt_00->rect).h = (cnt_00->content_size).y + ((cnt_00->rect).h - uVar7);
    }
    if ((((opt & 0x400U) != 0) && (ctx->mouse_pressed != 0)) && (ctx->hover_root != cnt_00)) {
      cnt_00->open = 0;
    }
    mu_push_clip_rect(ctx,cnt_00->body);
    rect_local.w = 1;
  }
  return rect_local.w;
}

Assistant:

int mu_begin_window_ex(mu_Context *ctx, const char *title, mu_Rect rect, int opt) {
  mu_Rect body;
  mu_Id id = mu_get_id(ctx, title, strlen(title));
  mu_Container *cnt = get_container(ctx, id, opt);
  if (!cnt || !cnt->open) { return 0; }
  push(ctx->id_stack, id);

  if (cnt->rect.w == 0 || opt & MU_OPT_FORCE_RESIZE) {
    cnt->rect = rect;
  }
  begin_root_container(ctx, cnt);
  rect = body = cnt->rect;

  /* draw frame */
  if (~opt & MU_OPT_NOFRAME) {
    ctx->draw_frame(ctx, rect, MU_COLOR_WINDOWBG);
  }

  /* do title bar */
  if (~opt & MU_OPT_NOTITLE) {
    mu_Rect tr = rect;
    tr.h = ctx->style->title_height;
    ctx->draw_frame(ctx, tr, MU_COLOR_TITLEBG);

    /* do title text */
    if (~opt & MU_OPT_NOTITLE) {
      mu_Id id = mu_get_id(ctx, "!title", 6);
      mu_update_control(ctx, id, tr, opt);
      mu_draw_control_text(ctx, title, tr, MU_COLOR_TITLETEXT, opt);
      if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
        cnt->rect.x += ctx->mouse_delta.x;
        cnt->rect.y += ctx->mouse_delta.y;
      }
      body.y += tr.h;
      body.h -= tr.h;
    }

    /* do `close` button */
    if (~opt & MU_OPT_NOCLOSE) {
      mu_Id id = mu_get_id(ctx, "!close", 6);
      mu_Rect r = mu_rect(tr.x + tr.w - tr.h, tr.y, tr.h, tr.h);
      tr.w -= r.w;
      mu_draw_icon(ctx, MU_ICON_CLOSE, r, ctx->style->colors[MU_COLOR_TITLETEXT]);
      mu_update_control(ctx, id, r, opt);
      if (ctx->mouse_pressed == MU_MOUSE_LEFT && id == ctx->focus) {
        cnt->open = 0;
      }
    }
  }

  push_container_body(ctx, cnt, body, opt);

  /* do `resize` handle */
  if (~opt & MU_OPT_NORESIZE) {
    int sz = ctx->style->title_height;
    mu_Id id = mu_get_id(ctx, "!resize", 7);
    mu_Rect r = mu_rect(rect.x + rect.w - sz, rect.y + rect.h - sz, sz, sz);
    mu_update_control(ctx, id, r, opt);
    if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
      cnt->rect.w = mu_max(96, cnt->rect.w + ctx->mouse_delta.x);
      cnt->rect.h = mu_max(64, cnt->rect.h + ctx->mouse_delta.y);
    }
  }

  /* resize to content size */
  if (opt & MU_OPT_AUTOSIZE) {
    mu_Rect r = get_layout(ctx)->body;
    cnt->rect.w = cnt->content_size.x + (cnt->rect.w - r.w);
    cnt->rect.h = cnt->content_size.y + (cnt->rect.h - r.h);
  }

  /* close if this is a popup window and elsewhere was clicked */
  if (opt & MU_OPT_POPUP && ctx->mouse_pressed && ctx->hover_root != cnt) {
    cnt->open = 0;
  }

  mu_push_clip_rect(ctx, cnt->body);
  return MU_RES_ACTIVE;
}